

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

Gia_ManTer_t * Gia_ManTerSimulate(Gia_Man_t *pAig,int fVerbose)

{
  Gia_Man_t *pGVar1;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Vec_Int_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  uint **pBins;
  int iVar7;
  Gia_ManTer_t *p;
  uint *puVar8;
  uint *puVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  timespec ts;
  timespec local_60;
  long local_50;
  Gia_Man_t *local_48;
  uint **local_40;
  uint *local_38;
  
  iVar7 = clock_gettime(3,&local_60);
  if (iVar7 < 0) {
    local_50 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    local_50 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  if (pAig->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTsim.c"
                  ,0x2a2,"Gia_ManTer_t *Gia_ManTerSimulate(Gia_Man_t *, int)");
  }
  clock_gettime(3,&local_60);
  p = Gia_ManTerCreate(pAig);
  pGVar1 = p->pAig;
  pVVar2 = pGVar1->vCis;
  iVar7 = pVVar2->nSize;
  uVar13 = 0;
  if (pGVar1->nRegs < iVar7) {
    puVar8 = p->pDataSimCis;
    bVar10 = 0;
    uVar13 = 0;
    do {
      uVar16 = puVar8[uVar13 >> 4];
      puVar8[uVar13 >> 4] = (~(uVar16 >> (bVar10 & 0x1e)) & 3) << (bVar10 & 0x1e) ^ uVar16;
      uVar13 = uVar13 + 1;
      iVar7 = pVVar2->nSize;
      bVar10 = bVar10 + 2;
    } while ((int)uVar13 < iVar7 - pGVar1->nRegs);
  }
  if ((int)uVar13 < iVar7) {
    puVar8 = p->pDataSimCis;
    iVar7 = uVar13 * 2;
    do {
      uVar16 = puVar8[uVar13 >> 4];
      bVar10 = (byte)iVar7 & 0x1e;
      puVar8[uVar13 >> 4] = (uVar16 >> bVar10 & 3 ^ 1) << bVar10 ^ uVar16;
      uVar13 = uVar13 + 1;
      iVar7 = iVar7 + 2;
    } while ((int)uVar13 < pVVar2->nSize);
  }
  local_48 = pAig;
  puVar8 = Gia_ManTerStateCreate(p);
  iVar7 = p->nStateWords;
  iVar17 = p->nBins;
  local_40 = p->pBins;
  Gia_ManTerStateInsert(puVar8,iVar7,local_40,iVar17);
  if (0 < pGVar1->nFront) {
    puVar8 = (uint *)0x0;
    iVar12 = 0;
    do {
      pGVar3 = pGVar1->pObjs;
      local_38 = puVar8;
      if (pGVar3->Value != 0) {
        __assert_fail("Gia_ManConst0(p->pAig)->Value == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTsim.c"
                      ,0x17b,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
      }
      puVar8 = p->pDataSim;
      *puVar8 = (*puVar8 & 0xfffffffc) + 1;
      iVar11 = 0;
      iVar18 = 0;
      if (1 < pGVar1->nObjs) {
        puVar9 = &pGVar3[1].Value;
        iVar18 = 0;
        lVar14 = 1;
        iVar11 = 0;
        do {
          uVar4 = *(ulong *)(puVar9 + -2);
          uVar13 = (uint)uVar4;
          if ((int)uVar13 < 0) {
            uVar16 = *puVar9;
            if ((~uVar13 & 0x9fffffff) == 0) {
              if (pGVar1->nFront <= (int)uVar16) {
                __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTsim.c"
                              ,0x186,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
              }
              uVar13 = p->pDataSimCis[iVar11 >> 4] >> ((char)iVar11 * '\x02' & 0x1fU);
              if ((uVar13 & 3) == 0) goto LAB_0078cd32;
              bVar10 = (char)uVar16 * '\x02';
              iVar11 = iVar11 + 1;
              puVar8[(int)uVar16 >> 4] =
                   ((puVar8[(int)uVar16 >> 4] >> (bVar10 & 0x1f) ^ uVar13) & 3) << (bVar10 & 0x1f) ^
                   puVar8[(int)uVar16 >> 4];
            }
            else {
              if (uVar16 != 0x1fffffff) {
                __assert_fail("Gia_ObjValue(pObj) == GIA_NONE",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTsim.c"
                              ,0x18b,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
              }
              uVar16 = *(uint *)((long)puVar8 + (ulong)((uVar13 & 0x1ffffff0) >> 2)) >>
                       ((char)uVar4 * '\x02' & 0x1fU) & 3;
              uVar13 = (((uVar13 >> 0x1d & 1) != 0) + 1 != uVar16) + 1;
              if (uVar16 == 3) {
                uVar13 = 3;
              }
              uVar16 = p->pDataSimCos[iVar18 >> 4];
              bVar10 = (char)iVar18 * '\x02';
              p->pDataSimCos[iVar18 >> 4] =
                   (uVar16 >> (bVar10 & 0x1f) & 3 ^ uVar13) << (bVar10 & 0x1f) ^ uVar16;
              iVar18 = iVar18 + 1;
            }
          }
          else {
            uVar16 = *puVar9;
            if (pGVar1->nFront <= (int)uVar16) {
              __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTsim.c"
                            ,0x181,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
            }
            uVar19 = *(uint *)((long)puVar8 + (ulong)((uVar13 & 0x1ffffff0) >> 2)) >>
                     ((char)uVar4 * '\x02' & 0x1fU) & 3;
            uVar15 = *(uint *)((long)puVar8 + (ulong)(((uint)(uVar4 >> 0x20) & 0x1ffffff0) >> 2)) >>
                     ((char)(uVar4 >> 0x20) * '\x02' & 0x1fU) & 3;
            uVar20 = (uVar15 == 3 || uVar19 == 3) | 2;
            if (((uVar4 >> 0x3d & 1) != 0) + 1 == uVar15) {
              uVar20 = 1;
            }
            if (((uVar13 >> 0x1d & 1) != 0) + 1 == uVar19) {
              uVar20 = 1;
            }
            bVar10 = (char)uVar16 * '\x02';
            puVar8[(int)uVar16 >> 4] =
                 (puVar8[(int)uVar16 >> 4] >> (bVar10 & 0x1f) & 3 ^ uVar20) << (bVar10 & 0x1f) ^
                 puVar8[(int)uVar16 >> 4];
          }
          lVar14 = lVar14 + 1;
          puVar9 = puVar9 + 3;
        } while (lVar14 < pGVar1->nObjs);
      }
      pVVar2 = pGVar1->vCis;
      if (pVVar2->nSize != iVar11) {
        __assert_fail("Gia_ManCiNum(p->pAig) == iCis",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTsim.c"
                      ,399,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
      }
      pVVar5 = pGVar1->vCos;
      if (pVVar5->nSize != iVar18) {
        __assert_fail("Gia_ManCoNum(p->pAig) == iCos",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTsim.c"
                      ,400,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
      }
      uVar13 = 0;
      if (pGVar1->nRegs < iVar11) {
        puVar8 = p->pDataSimCis;
        bVar10 = 0;
        uVar13 = 0;
        do {
          uVar16 = puVar8[uVar13 >> 4];
          puVar8[uVar13 >> 4] = (~(uVar16 >> (bVar10 & 0x1e)) & 3) << (bVar10 & 0x1e) ^ uVar16;
          uVar13 = uVar13 + 1;
          iVar11 = pVVar2->nSize;
          bVar10 = bVar10 + 2;
        } while ((int)uVar13 < iVar11 - pGVar1->nRegs);
      }
      if ((int)uVar13 < iVar11) {
        puVar8 = p->pDataSimCos;
        iVar18 = uVar13 * 2;
        do {
          iVar11 = (pVVar5->nSize - iVar11) + uVar13;
          uVar16 = puVar8[iVar11 >> 4] >> ((char)iVar11 * '\x02' & 0x1fU);
          if ((uVar16 & 3) == 0) {
LAB_0078cd32:
            __assert_fail("Value >= GIA_ZER && Value <= GIA_UND",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTsim.c"
                          ,0x24,"void Gia_ManTerSimInfoSet(unsigned int *, int, int)");
          }
          uVar20 = p->pDataSimCis[uVar13 >> 4];
          bVar10 = (byte)iVar18 & 0x1e;
          p->pDataSimCis[uVar13 >> 4] = ((uVar20 >> bVar10 ^ uVar16) & 3) << bVar10 ^ uVar20;
          uVar13 = uVar13 + 1;
          iVar11 = pVVar2->nSize;
          iVar18 = iVar18 + 2;
        } while ((int)uVar13 < iVar11);
      }
      puVar8 = Gia_ManTerStateCreate(p);
      pBins = local_40;
      puVar9 = Gia_ManTerStateLookup(puVar8,iVar7,local_40,iVar17);
      if (puVar9 != (uint *)0x0) {
        pVVar6 = p->vStates;
        iVar7 = pVVar6->nSize;
        local_48->nTerStates = iVar7;
        iVar17 = -1;
        if ((long)iVar7 < 1) goto LAB_0078cc7f;
        lVar14 = 0;
        goto LAB_0078cc66;
      }
      Gia_ManTerStateInsert(puVar8,iVar7,pBins,iVar17);
      if ((((uint)(iVar12 * -0x33333333) >> 1 | (uint)((iVar12 * -0x33333333 & 1U) != 0) << 0x1f) <
           0x1999999a) && (p->nIters <= iVar12)) {
        Gia_ManTerRetire(p,puVar8,local_38);
      }
      iVar12 = iVar12 + 1;
    } while (0 < pGVar1->nFront);
  }
  __assert_fail("p->pAig->nFront > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTsim.c"
                ,0x17a,"void Gia_ManTerSimulateRound(Gia_ManTer_t *)");
  while (lVar14 = lVar14 + 1, iVar7 != lVar14) {
LAB_0078cc66:
    if ((uint *)pVVar6->pArray[lVar14] == puVar9) {
      iVar17 = (int)lVar14;
      break;
    }
  }
LAB_0078cc7f:
  local_48->nTerLoop = iVar17;
  if (fVerbose != 0) {
    iVar7 = 0x99a1a6;
    printf("Ternary simulation saturated after %d iterations. ",(ulong)(iVar12 + 1));
    Abc_Print(iVar7,"%s =","Time");
    iVar17 = 3;
    iVar7 = clock_gettime(3,&local_60);
    if (iVar7 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    Abc_Print(iVar17,"%9.2f sec\n",(double)(lVar14 + local_50) / 1000000.0);
  }
  return p;
}

Assistant:

Gia_ManTer_t * Gia_ManTerSimulate( Gia_Man_t * pAig, int fVerbose )
{
    Gia_ManTer_t * p;
    unsigned * pState, * pPrev, * pLoop;
    int i, Counter;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManRegNum(pAig) > 0 );
    // create manager
    clk = Abc_Clock();
    p = Gia_ManTerCreate( pAig );
    if ( 0 )
    {
        printf( "Obj = %8d (%8d). F = %6d. ", 
            pAig->nObjs, Gia_ManCiNum(pAig) + Gia_ManAndNum(pAig), p->pAig->nFront );
        printf( "AIG = %7.2f MB. F-mem = %7.2f MB. Other = %7.2f MB.  ", 
            12.0*Gia_ManObjNum(p->pAig)/(1<<20), 
            4.0*Abc_BitWordNum(2 * p->pAig->nFront)/(1<<20), 
            4.0*Abc_BitWordNum(2 * (Gia_ManCiNum(pAig) + Gia_ManCoNum(pAig)))/(1<<20) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    // perform simulation
    Gia_ManTerSimInfoInit( p );
    // hash the first state
    pState = Gia_ManTerStateCreate( p );
    Gia_ManTerStateInsert( pState, p->nStateWords, p->pBins, p->nBins );
//Gia_ManTerStatePrint( pState, Gia_ManRegNum(pAig), 0 );
    // perform simuluation till convergence
    pPrev = NULL;
    for ( i = 0; ; i++ )
    {
        Gia_ManTerSimulateRound( p );
        Gia_ManTerSimInfoTransfer( p );
        pState = Gia_ManTerStateCreate( p );
//Gia_ManTerStatePrint( pState, Gia_ManRegNum(pAig), i+1 );
        if ( (pLoop = Gia_ManTerStateLookup(pState, p->nStateWords, p->pBins, p->nBins)) )
        {
            pAig->nTerStates = Vec_PtrSize( p->vStates );
            pAig->nTerLoop = Vec_PtrFind( p->vStates, pLoop );
            break;
        }
        Gia_ManTerStateInsert( pState, p->nStateWords, p->pBins, p->nBins );
        if ( i >= p->nIters && i % 10 == 0 )
        {
            Counter = Gia_ManTerRetire( p, pState, pPrev );
//            Counter = Gia_ManTerRetire2( p, pState );
//            if ( fVerbose )
//                printf( "Retired %d registers.\n", Counter );
        }
        pPrev = pState;
    }
    if ( fVerbose )
    {
        printf( "Ternary simulation saturated after %d iterations. ", i+1 );
        ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    return p;
}